

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O1

void read_engr_at(int x,int y)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  engr *peVar6;
  char buf [256];
  char acStack_128 [231];
  undefined1 local_41;
  
  for (peVar6 = level->lev_engr; peVar6 != (engr *)0x0; peVar6 = peVar6->nxt_engr) {
    if ((peVar6->engr_x == (char)x) && (peVar6->engr_y == (char)y)) goto LAB_00198967;
  }
  peVar6 = (engr *)0x0;
LAB_00198967:
  if (peVar6 == (engr *)0x0) {
    return;
  }
  if (*peVar6->engr_txt == '\0') {
    return;
  }
  if ((flags.run == 8) && ((level->locations[x][y].field_0x6 & 4) != 0)) {
    return;
  }
  switch(peVar6->engr_type) {
  case '\x01':
    if ((u.uprops[0x1e].intrinsic != 0) ||
       (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
        (((youmonst.data)->mflags1 & 0x1000) != 0)))) {
      if (ublindf == (obj *)0x0) {
        return;
      }
      if (ublindf->oartifact != '\x1d') {
        return;
      }
    }
    bVar1 = is_ice(level,x,y);
    pcVar3 = "frost";
    if (bVar1 == '\0') {
      pcVar3 = "dust";
    }
    pcVar5 = "Something is written here in the %s.";
    break;
  case '\x02':
  case '\x06':
    if ((((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed))))
        || (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
       (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
        (bVar1 = can_reach_floor(), bVar1 == '\0')))) {
      return;
    }
    pcVar3 = surface(x,y);
    pcVar5 = "Something is engraved here on the %s.";
    break;
  case '\x03':
    if ((((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed))))
        || (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
       (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
        (bVar1 = can_reach_floor(), bVar1 == '\0')))) {
      return;
    }
    bVar1 = is_ice(level,x,y);
    pcVar3 = "melted";
    if (bVar1 == '\0') {
      pcVar3 = "burned";
    }
    pcVar5 = surface(x,y);
    pline("Some text has been %s into the %s here.",pcVar3,pcVar5);
    goto LAB_00198c99;
  case '\x04':
    if (((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
       (((youmonst.data)->mflags1 & 0x1000) != 0)) {
      if (ublindf == (obj *)0x0) {
        return;
      }
      if (ublindf->oartifact != '\x1d') {
        return;
      }
    }
    pcVar3 = surface(x,y);
    pcVar5 = "There\'s some graffiti on the %s here.";
    break;
  case '\x05':
    if ((u.uprops[0x1e].intrinsic != 0) ||
       (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
        (((youmonst.data)->mflags1 & 0x1000) != 0)))) {
      if (ublindf == (obj *)0x0) {
        return;
      }
      if (ublindf->oartifact != '\x1d') {
        return;
      }
    }
    pline("You see a message scrawled in blood here.");
    goto LAB_00198c99;
  default:
    warning("Something is written in a very strange way.");
    goto LAB_00198c99;
  }
  pline(pcVar5,pcVar3);
LAB_00198c99:
  pcVar3 = peVar6->engr_txt;
  sVar4 = strlen(pcVar3);
  if (0xe7 < sVar4) {
    strncpy(acStack_128,pcVar3,0xe7);
    local_41 = 0;
    pcVar3 = acStack_128;
  }
  if ((u.roleplay.illiterate == '\0') || (iVar2 = strcmp(pcVar3,"X"), iVar2 == 0)) {
    if (((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
       (((youmonst.data)->mflags1 & 0x1000) == 0)) {
      pcVar5 = "read";
    }
    else if (ublindf == (obj *)0x0) {
      pcVar5 = "feel the words";
    }
    else {
      pcVar5 = "feel the words";
      if (ublindf->oartifact == '\x1d') {
        pcVar5 = "read";
      }
    }
    pline("You %s: \"%s\".",pcVar5,pcVar3);
  }
  else {
    pline("But you cannot read.");
  }
  if (1 < flags.run) {
    nomul(0,(char *)0x0);
  }
  if (5 < moves) {
    check_tutorial_message(0x14f);
  }
  return;
}

Assistant:

void read_engr_at(int x, int y)
{
	struct engr *ep = engr_at(level, x,y);
	int	sensed = 0;
	char buf[BUFSZ];
	
	/* Sensing an engraving does not require sight,
	 * nor does it necessarily imply comprehension (literacy).
	 */
	if (ep && ep->engr_txt[0] &&
	    /* Don't stop if travelling or autoexploring. */
	    !(flags.run == 8 && level->locations[x][y].mem_stepped)) {
	    switch(ep->engr_type) {
	    case DUST:
		if (!Blind) {
			sensed = 1;
			pline("Something is written here in the %s.",
				is_ice(level, x, y) ? "frost" : "dust");
		}
		break;
	    case ENGRAVE:
	    case HEADSTONE:
		if (!Blind || can_reach_floor()) {
			sensed = 1;
			pline("Something is engraved here on the %s.",
				surface(x,y));
		}
		break;
	    case BURN:
		if (!Blind || can_reach_floor()) {
			sensed = 1;
			pline("Some text has been %s into the %s here.",
				is_ice(level, x, y) ? "melted" : "burned",
				surface(x, y));
		}
		break;
	    case MARK:
		if (!Blind) {
			sensed = 1;
			pline("There's some graffiti on the %s here.",
				surface(x,y));
		}
		break;
	    case ENGR_BLOOD:
		/* "It's a message!  Scrawled in blood!"
		 * "What's it say?"
		 * "It says... `See you next Wednesday.'" -- Thriller
		 */
		if (!Blind) {
			sensed = 1;
			pline("You see a message scrawled in blood here.");
		}
		break;
	    default:
		warning("Something is written in a very strange way.");
		sensed = 1;
	    }
	    if (sensed) {
		char *et;
		unsigned maxelen = BUFSZ - sizeof("You feel the words: \"\". ");
		if (strlen(ep->engr_txt) > maxelen) {
			strncpy(buf,  ep->engr_txt, (int)maxelen);
			buf[maxelen] = '\0';
			et = buf;
		} else
			et = ep->engr_txt;
		if (u.roleplay.illiterate && strcmp(et, "X")) {
		    pline("But you cannot read.");
		} else {
		    pline("You %s: \"%s\".",
			  (Blind) ? "feel the words" : "read",  et);
		}
		if (flags.run > 1) nomul(0, NULL);
		if (moves > 5) check_tutorial_message(QT_T_ENGRAVING);
	    }
	}
}